

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextboundaryfinder.cpp
# Opt level: O0

bool __thiscall QTextBoundaryFinder::isAtBoundary(QTextBoundaryFinder *this)

{
  long lVar1;
  qsizetype qVar2;
  undefined4 *in_RDI;
  bool local_29;
  bool local_1;
  
  if (((*(long *)(in_RDI + 0x10) == 0) || (*(long *)(in_RDI + 0xc) < 0)) ||
     (lVar1 = *(long *)(in_RDI + 0xc), qVar2 = QStringView::size((QStringView *)(in_RDI + 8)),
     qVar2 < lVar1)) {
    local_1 = false;
  }
  else {
    switch(*in_RDI) {
    case 0:
      local_1 = (*(byte *)(*(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 0xc)) & 1) != 0;
      break;
    case 1:
      local_1 = (*(byte *)(*(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 0xc)) >> 1 & 1) != 0;
      break;
    case 2:
      local_1 = (*(byte *)(*(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 0xc)) >> 2 & 1) != 0;
      break;
    case 3:
      local_29 = true;
      if ((*(byte *)(*(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 0xc)) >> 3 & 1) == 0) {
        local_29 = *(long *)(in_RDI + 0xc) == 0;
      }
      local_1 = local_29;
      break;
    default:
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool QTextBoundaryFinder::isAtBoundary() const
{
    if (!attributes || pos < 0 || pos > sv.size())
        return false;

    switch(t) {
    case Grapheme:
        return attributes[pos].graphemeBoundary;
    case Word:
        return attributes[pos].wordBreak;
    case Sentence:
        return attributes[pos].sentenceBoundary;
    case Line:
        // ### TR#14 LB2 prohibits break at sot
        return attributes[pos].lineBreak || pos == 0;
    }
    return false;
}